

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster(FlatBufferBuilder *_fbb,MonsterT *_o,rehasher_function_t *_rehasher)

{
  float testf;
  float testf2;
  float testf3;
  Color color;
  Any test_type;
  AnyUniqueAliases any_unique_type;
  AnyAmbiguousAliases any_ambiguous_type;
  int16_t mana;
  int16_t hp;
  int32_t testhashs32_fnv1;
  uint32_t testhashu32_fnv1;
  int32_t testhashs32_fnv1a;
  int64_t testhashs64_fnv1;
  uint64_t testhashu64_fnv1;
  int64_t testhashs64_fnv1a;
  bool bVar1;
  bool bVar2;
  Offset<flatbuffers::String> name;
  Offset<void> test;
  Offset<void> any_unique;
  Offset<void> any_ambiguous;
  Offset<MyGame::Example::Monster> OVar3;
  size_type_conflict sVar4;
  pointer _o_00;
  pointer _o_01;
  unsigned_long uVar5;
  pointer _o_02;
  Color *v;
  uint64_t local_280;
  unsigned_long local_270;
  uint64_t local_258;
  uint32_t local_23c;
  Vec3 *local_220;
  double _double_inf_default;
  float _negative_infinity_default;
  float _negative_inf_default;
  float _positive_infinity_default;
  float _infinity_default;
  float _positive_inf_default;
  float _inf_default;
  float _nan_default;
  LongEnum _long_enum_normal_default;
  LongEnum _long_enum_non_enum_default;
  Test *_native_inline;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_160;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
  _scalar_key_sorted_tables;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _testrequirednestedflatbuffer;
  Race _signed_enum;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _vector_of_enums;
  Offset<void> _any_ambiguous;
  AnyAmbiguousAliases _any_ambiguous_type;
  Offset<void> _any_unique;
  AnyUniqueAliases _any_unique_type;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> _vector_of_non_owning_references;
  uint64_t _non_owning_reference;
  unsigned_long uStack_130;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> _vector_of_co_owning_references;
  uint64_t _co_owning_reference;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  _vector_of_strong_referrables;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> _vector_of_weak_references;
  uint64_t _single_weak_reference;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_108;
  Offset<MyGame::InParentNamespace> local_104;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  _vector_of_referrables;
  Offset<MyGame::InParentNamespace> _parent_namespace_test;
  Offset<flatbuffers::Vector<double,_unsigned_int>_> _vector_of_doubles;
  Offset<flatbuffers::Vector<long,_unsigned_int>_> _vector_of_longs;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> _test5;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _flex;
  Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
  _testarrayofsortedstruct;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  _testarrayofstring2;
  float _testf3;
  float _testf2;
  float _testf;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _testarrayofbools;
  uint64_t _testhashu64_fnv1a;
  int64_t _testhashs64_fnv1a;
  uint32_t _testhashu32_fnv1a;
  int32_t _testhashs32_fnv1a;
  uint64_t _testhashu64_fnv1;
  int64_t _testhashs64_fnv1;
  uint32_t _testhashu32_fnv1;
  int32_t _testhashs32_fnv1;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> OStack_9c;
  bool _testbool;
  Offset<MyGame::Example::Stat> _testempty;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _testnestedflatbuffer;
  Offset<MyGame::Example::Monster> _enemy;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_8c;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
  _testarrayoftables;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  _testarrayofstring;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> _test4;
  Offset<void> _test;
  Any _test_type;
  Color _color;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _inventory;
  Offset<flatbuffers::String> _name;
  int16_t _hp;
  int16_t _mana;
  pointer _pos;
  _VectorArgs _va;
  rehasher_function_t *_rehasher_local;
  MonsterT *_o_local;
  FlatBufferBuilder *_fbb_local;
  
  _pos = (pointer)_fbb;
  _va.__fbb = (FlatBufferBuilder *)_o;
  _va.__o = (MonsterT *)_rehasher;
  _va.__rehasher = _rehasher;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)_o);
  if (bVar1) {
    local_220 = std::unique_ptr<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>
                ::get(&_o->pos);
  }
  else {
    local_220 = (Vec3 *)0x0;
  }
  mana = _o->mana;
  hp = _o->hp;
  name = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                   (_fbb,&_o->name);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_o->inventory);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> *)&_test,0);
  }
  else {
    _test.o = (offset_type)
              flatbuffers::FlatBufferBuilderImpl<false>::
              CreateVector<unsigned_char,std::allocator<unsigned_char>>(_fbb,&_o->inventory);
  }
  color = _o->color;
  test_type = (_o->test).type;
  test = AnyUnion::Pack(&_o->test,_fbb,(rehasher_function_t *)0x0);
  sVar4 = std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::size
                    (&_o->test4);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> *)
               &_testarrayoftables,0);
  }
  else {
    _testarrayoftables.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Test>_>
                   (_fbb,&_o->test4);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&_o->testarrayofstring);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
              (&local_8c,0);
  }
  else {
    local_8c = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                         (_fbb,&_o->testarrayofstring);
  }
  sVar4 = std::
          vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
          ::size(&_o->testarrayoftables);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>::
    Offset((Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
            *)&_enemy,0);
  }
  else {
    sVar4 = std::
            vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
            ::size(&_o->testarrayoftables);
    _enemy.o = (offset_type)
               flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<flatbuffers::Offset<MyGame::Example::Monster>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                         (_fbb,sVar4,&_pos);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&_o->enemy);
  if (bVar1) {
    _o_00 = std::
            unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>::
            get(&_o->enemy);
    _testempty.o = (offset_type)CreateMonster(_fbb,_o_00,_va.__rehasher);
  }
  else {
    flatbuffers::Offset<MyGame::Example::Monster>::Offset
              ((Offset<MyGame::Example::Monster> *)&_testempty,0);
  }
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&_o->testnestedflatbuffer);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              (&stack0xffffffffffffff64,0);
  }
  else {
    OStack_9c = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<unsigned_char,std::allocator<unsigned_char>>
                          (_fbb,&_o->testnestedflatbuffer);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&_o->testempty);
  if (bVar1) {
    _o_01 = std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::
            get(&_o->testempty);
    _testhashs32_fnv1 = (int32_t)CreateStat(_fbb,_o_01,_va.__rehasher);
  }
  else {
    flatbuffers::Offset<MyGame::Example::Stat>::Offset
              ((Offset<MyGame::Example::Stat> *)&_testhashs32_fnv1,0);
  }
  bVar1 = _o->testbool;
  testhashs32_fnv1 = _o->testhashs32_fnv1;
  testhashu32_fnv1 = _o->testhashu32_fnv1;
  testhashs64_fnv1 = _o->testhashs64_fnv1;
  testhashu64_fnv1 = _o->testhashu64_fnv1;
  testhashs32_fnv1a = _o->testhashs32_fnv1a;
  if (_va.__rehasher == (rehasher_function_t *)0x0) {
    local_23c = 0;
  }
  else {
    uVar5 = std::function<unsigned_long_(void_*)>::operator()(_va.__rehasher,_o->testhashu32_fnv1a);
    local_23c = (uint32_t)uVar5;
  }
  testhashs64_fnv1a = _o->testhashs64_fnv1a;
  __testf = _o->testhashu64_fnv1a;
  sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&_o->testarrayofbools);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> *)&_testf2,0);
  }
  else {
    _testf2 = (float)flatbuffers::FlatBufferBuilderImpl<false>::CreateVector
                               (_fbb,&_o->testarrayofbools);
  }
  testf = _o->testf;
  testf2 = _o->testf2;
  testf3 = _o->testf3;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&_o->testarrayofstring2);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                *)&_flex,0);
  }
  else {
    _flex.o = (offset_type)
              flatbuffers::FlatBufferBuilderImpl<false>::
              CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                        (_fbb,&_o->testarrayofstring2);
  }
  sVar4 = std::vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>::size
                    (&_o->testarrayofsortedstruct);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>::
    Offset((Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_> *)&_test5,0
          );
  }
  else {
    _test5.o = (offset_type)
               flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVectorOfStructs<MyGame::Example::Ability,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Ability>_>
                         (_fbb,&_o->testarrayofsortedstruct);
  }
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_o->flex);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> *)&_vector_of_longs,0);
  }
  else {
    _vector_of_longs.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_char,std::allocator<unsigned_char>>(_fbb,&_o->flex);
  }
  sVar4 = std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::size
                    (&_o->test5);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> *)
               &_vector_of_doubles,0);
  }
  else {
    _vector_of_doubles.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Test>_>
                   (_fbb,&_o->test5);
  }
  sVar4 = std::vector<long,_std::allocator<long>_>::size(&_o->vector_of_longs);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<long,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<long,_unsigned_int>_> *)&_parent_namespace_test,0);
  }
  else {
    _parent_namespace_test.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<long,std::allocator<long>>
                   (_fbb,&_o->vector_of_longs);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&_o->vector_of_doubles);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<double,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<double,_unsigned_int>_> *)&_vector_of_referrables,0);
  }
  else {
    _vector_of_referrables.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<double,std::allocator<double>>
                   (_fbb,&_o->vector_of_doubles);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&_o->parent_namespace_test);
  if (bVar2) {
    _o_02 = std::
            unique_ptr<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
            ::get(&_o->parent_namespace_test);
    local_104 = CreateInParentNamespace(_fbb,_o_02,_va.__rehasher);
  }
  else {
    flatbuffers::Offset<MyGame::InParentNamespace>::Offset(&local_104,0);
  }
  sVar4 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&_o->vector_of_referrables);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>::
    Offset(&local_108,0);
  }
  else {
    sVar4 = std::
            vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ::size(&_o->vector_of_referrables);
    local_108 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                          (_fbb,sVar4,&_pos);
  }
  if (_va.__rehasher == (rehasher_function_t *)0x0) {
    local_258 = 0;
  }
  else {
    local_258 = std::function<unsigned_long_(void_*)>::operator()
                          (_va.__rehasher,_o->single_weak_reference);
  }
  sVar4 = std::
          vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
          size(&_o->vector_of_weak_references);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> *)
               &_vector_of_strong_referrables,0);
  }
  else {
    sVar4 = std::
            vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
            ::size(&_o->vector_of_weak_references);
    _vector_of_strong_referrables.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_3_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar4,&_pos);
  }
  sVar4 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&_o->vector_of_strong_referrables);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>::
    Offset((Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
            *)((long)&_co_owning_reference + 4),0);
  }
  else {
    sVar4 = std::
            vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ::size(&_o->vector_of_strong_referrables);
    _co_owning_reference._4_4_ =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_4_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar4,&_pos);
  }
  if (_va.__rehasher == (rehasher_function_t *)0x0) {
    local_270 = 0;
  }
  else {
    local_270 = std::function<unsigned_long_(void_*)>::operator()
                          (_va.__rehasher,_o->co_owning_reference);
  }
  uStack_130 = local_270;
  sVar4 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&_o->vector_of_co_owning_references);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> *)
               ((long)&_non_owning_reference + 4),0);
  }
  else {
    sVar4 = std::
            vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ::size(&_o->vector_of_co_owning_references);
    _non_owning_reference._4_4_ =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_5_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar4,&_pos);
  }
  if (_va.__rehasher == (rehasher_function_t *)0x0) {
    local_280 = 0;
  }
  else {
    local_280 = std::function<unsigned_long_(void_*)>::operator()
                          (_va.__rehasher,_o->non_owning_reference);
  }
  sVar4 = std::
          vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
          size(&_o->vector_of_non_owning_references);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> *)&_any_unique,0);
  }
  else {
    sVar4 = std::
            vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
            ::size(&_o->vector_of_non_owning_references);
    _any_unique.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_6_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar4,&_pos);
  }
  any_unique_type = (_o->any_unique).type;
  any_unique = AnyUniqueAliasesUnion::Pack(&_o->any_unique,_fbb,(rehasher_function_t *)0x0);
  any_ambiguous_type = (_o->any_ambiguous).type;
  any_ambiguous = AnyAmbiguousAliasesUnion::Pack(&_o->any_ambiguous,_fbb,(rehasher_function_t *)0x0)
  ;
  sVar4 = std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::size
                    (&_o->vector_of_enums);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              (&_testrequirednestedflatbuffer,0);
  }
  else {
    v = flatbuffers::data<MyGame::Example::Color,std::allocator<MyGame::Example::Color>>
                  (&_o->vector_of_enums);
    sVar4 = std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::size
                      (&_o->vector_of_enums);
    _testrequirednestedflatbuffer =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorScalarCast<unsigned_char,MyGame::Example::Color>(_fbb,v,sVar4);
  }
  _scalar_key_sorted_tables.o._3_1_ = _o->signed_enum;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&_o->testrequirednestedflatbuffer);
  if (sVar4 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_160,0);
  }
  else {
    local_160 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<unsigned_char,std::allocator<unsigned_char>>
                          (_fbb,&_o->testrequirednestedflatbuffer);
  }
  sVar4 = std::
          vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
          ::size(&_o->scalar_key_sorted_tables);
  if (sVar4 == 0) {
    flatbuffers::
    Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
                *)((long)&_native_inline + 4),0);
  }
  else {
    sVar4 = std::
            vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
            ::size(&_o->scalar_key_sorted_tables);
    _native_inline._4_4_ =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<flatbuffers::Offset<MyGame::Example::Stat>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_7_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar4,&_pos);
  }
  OVar3 = CreateMonster(_fbb,local_220,mana,hp,name,_test.o,color,test_type,test,
                        _testarrayoftables.o,local_8c,_enemy.o,_testempty.o,OStack_9c,
                        (Offset<MyGame::Example::Stat>)_testhashs32_fnv1,(bool)(bVar1 & 1),
                        testhashs32_fnv1,testhashu32_fnv1,testhashs64_fnv1,testhashu64_fnv1,
                        testhashs32_fnv1a,local_23c,testhashs64_fnv1a,__testf,
                        (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)_testf2,testf,
                        testf2,testf3,_flex.o,_test5.o,_vector_of_longs.o,_vector_of_doubles.o,
                        _parent_namespace_test.o,_vector_of_referrables.o,local_104,local_108,
                        local_258,_vector_of_strong_referrables.o,_co_owning_reference._4_4_,
                        uStack_130,_non_owning_reference._4_4_,local_280,_any_unique.o,
                        any_unique_type,any_unique,any_ambiguous_type,any_ambiguous,
                        _testrequirednestedflatbuffer,_scalar_key_sorted_tables.o._3_1_,local_160,
                        _native_inline._4_4_,&_o->native_inline,_o->long_enum_non_enum_default,
                        _o->long_enum_normal_default,_o->nan_default,_o->inf_default,
                        _o->positive_inf_default,_o->infinity_default,_o->positive_infinity_default,
                        _o->negative_inf_default,_o->negative_infinity_default,
                        _o->double_inf_default);
  return (Offset<MyGame::Example::Monster>)OVar3.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(::flatbuffers::FlatBufferBuilder &_fbb, const MonsterT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MonsterT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _pos = _o->pos ? _o->pos.get() : nullptr;
  auto _mana = _o->mana;
  auto _hp = _o->hp;
  auto _name = _fbb.CreateString(_o->name);
  auto _inventory = _o->inventory.size() ? _fbb.CreateVector(_o->inventory) : 0;
  auto _color = _o->color;
  auto _test_type = _o->test.type;
  auto _test = _o->test.Pack(_fbb);
  auto _test4 = _o->test4.size() ? _fbb.CreateVectorOfStructs(_o->test4) : 0;
  auto _testarrayofstring = _o->testarrayofstring.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring) : 0;
  auto _testarrayoftables = _o->testarrayoftables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Monster>> (_o->testarrayoftables.size(), [](size_t i, _VectorArgs *__va) { return CreateMonster(*__va->__fbb, __va->__o->testarrayoftables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _enemy = _o->enemy ? CreateMonster(_fbb, _o->enemy.get(), _rehasher) : 0;
  auto _testnestedflatbuffer = _o->testnestedflatbuffer.size() ? _fbb.CreateVector(_o->testnestedflatbuffer) : 0;
  auto _testempty = _o->testempty ? CreateStat(_fbb, _o->testempty.get(), _rehasher) : 0;
  auto _testbool = _o->testbool;
  auto _testhashs32_fnv1 = _o->testhashs32_fnv1;
  auto _testhashu32_fnv1 = _o->testhashu32_fnv1;
  auto _testhashs64_fnv1 = _o->testhashs64_fnv1;
  auto _testhashu64_fnv1 = _o->testhashu64_fnv1;
  auto _testhashs32_fnv1a = _o->testhashs32_fnv1a;
  auto _testhashu32_fnv1a = _rehasher ? static_cast<uint32_t>((*_rehasher)(_o->testhashu32_fnv1a)) : 0;
  auto _testhashs64_fnv1a = _o->testhashs64_fnv1a;
  auto _testhashu64_fnv1a = _o->testhashu64_fnv1a;
  auto _testarrayofbools = _o->testarrayofbools.size() ? _fbb.CreateVector(_o->testarrayofbools) : 0;
  auto _testf = _o->testf;
  auto _testf2 = _o->testf2;
  auto _testf3 = _o->testf3;
  auto _testarrayofstring2 = _o->testarrayofstring2.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring2) : 0;
  auto _testarrayofsortedstruct = _o->testarrayofsortedstruct.size() ? _fbb.CreateVectorOfStructs(_o->testarrayofsortedstruct) : 0;
  auto _flex = _o->flex.size() ? _fbb.CreateVector(_o->flex) : 0;
  auto _test5 = _o->test5.size() ? _fbb.CreateVectorOfStructs(_o->test5) : 0;
  auto _vector_of_longs = _o->vector_of_longs.size() ? _fbb.CreateVector(_o->vector_of_longs) : 0;
  auto _vector_of_doubles = _o->vector_of_doubles.size() ? _fbb.CreateVector(_o->vector_of_doubles) : 0;
  auto _parent_namespace_test = _o->parent_namespace_test ? CreateInParentNamespace(_fbb, _o->parent_namespace_test.get(), _rehasher) : 0;
  auto _vector_of_referrables = _o->vector_of_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _single_weak_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->single_weak_reference)) : 0;
  auto _vector_of_weak_references = _o->vector_of_weak_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_weak_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_weak_references[i])) : 0; }, &_va ) : 0;
  auto _vector_of_strong_referrables = _o->vector_of_strong_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_strong_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_strong_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _co_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->co_owning_reference)) : 0;
  auto _vector_of_co_owning_references = _o->vector_of_co_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_co_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_co_owning_references[i].get())) : 0; }, &_va ) : 0;
  auto _non_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->non_owning_reference)) : 0;
  auto _vector_of_non_owning_references = _o->vector_of_non_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_non_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_non_owning_references[i])) : 0; }, &_va ) : 0;
  auto _any_unique_type = _o->any_unique.type;
  auto _any_unique = _o->any_unique.Pack(_fbb);
  auto _any_ambiguous_type = _o->any_ambiguous.type;
  auto _any_ambiguous = _o->any_ambiguous.Pack(_fbb);
  auto _vector_of_enums = _o->vector_of_enums.size() ? _fbb.CreateVectorScalarCast<uint8_t>(::flatbuffers::data(_o->vector_of_enums), _o->vector_of_enums.size()) : 0;
  auto _signed_enum = _o->signed_enum;
  auto _testrequirednestedflatbuffer = _o->testrequirednestedflatbuffer.size() ? _fbb.CreateVector(_o->testrequirednestedflatbuffer) : 0;
  auto _scalar_key_sorted_tables = _o->scalar_key_sorted_tables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Stat>> (_o->scalar_key_sorted_tables.size(), [](size_t i, _VectorArgs *__va) { return CreateStat(*__va->__fbb, __va->__o->scalar_key_sorted_tables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _native_inline = &_o->native_inline;
  auto _long_enum_non_enum_default = _o->long_enum_non_enum_default;
  auto _long_enum_normal_default = _o->long_enum_normal_default;
  auto _nan_default = _o->nan_default;
  auto _inf_default = _o->inf_default;
  auto _positive_inf_default = _o->positive_inf_default;
  auto _infinity_default = _o->infinity_default;
  auto _positive_infinity_default = _o->positive_infinity_default;
  auto _negative_inf_default = _o->negative_inf_default;
  auto _negative_infinity_default = _o->negative_infinity_default;
  auto _double_inf_default = _o->double_inf_default;
  return MyGame::Example::CreateMonster(
      _fbb,
      _pos,
      _mana,
      _hp,
      _name,
      _inventory,
      _color,
      _test_type,
      _test,
      _test4,
      _testarrayofstring,
      _testarrayoftables,
      _enemy,
      _testnestedflatbuffer,
      _testempty,
      _testbool,
      _testhashs32_fnv1,
      _testhashu32_fnv1,
      _testhashs64_fnv1,
      _testhashu64_fnv1,
      _testhashs32_fnv1a,
      _testhashu32_fnv1a,
      _testhashs64_fnv1a,
      _testhashu64_fnv1a,
      _testarrayofbools,
      _testf,
      _testf2,
      _testf3,
      _testarrayofstring2,
      _testarrayofsortedstruct,
      _flex,
      _test5,
      _vector_of_longs,
      _vector_of_doubles,
      _parent_namespace_test,
      _vector_of_referrables,
      _single_weak_reference,
      _vector_of_weak_references,
      _vector_of_strong_referrables,
      _co_owning_reference,
      _vector_of_co_owning_references,
      _non_owning_reference,
      _vector_of_non_owning_references,
      _any_unique_type,
      _any_unique,
      _any_ambiguous_type,
      _any_ambiguous,
      _vector_of_enums,
      _signed_enum,
      _testrequirednestedflatbuffer,
      _scalar_key_sorted_tables,
      _native_inline,
      _long_enum_non_enum_default,
      _long_enum_normal_default,
      _nan_default,
      _inf_default,
      _positive_inf_default,
      _infinity_default,
      _positive_infinity_default,
      _negative_inf_default,
      _negative_infinity_default,
      _double_inf_default);
}